

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void anon_unknown.dwarf_11cad6::ClearLoadStoreInfoAliasing
               (VmModule *module,VmInstruction *storeInst)

{
  SmallArray<VmModule::LoadStoreInfo,_32U> *this;
  VariableData *pVVar1;
  bool bVar2;
  LoadStoreInfo *pLVar3;
  VmConstant **ppVVar4;
  VmValue **ppVVar5;
  LoadStoreInfo *pLVar6;
  long lVar7;
  uint index;
  SmallArray<VmConstant_*,_8U> *this_00;
  byte bVar8;
  
  bVar8 = 0;
  this = &module->loadStoreInfo;
  index = 0;
  do {
    while( true ) {
      if ((module->loadStoreInfo).count <= index) {
        return;
      }
      pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](this,index);
      if ((pLVar3->noLoadOrNoContainerAlias != true) || (pLVar3->noStoreOrNoContainerAlias != true))
      break;
      if ((pLVar3->storeAddress != (VmConstant *)0x0) &&
         (pVVar1 = pLVar3->storeAddress->container, (pVVar1->users).count == 1)) {
        this_00 = &pVVar1->users;
        ppVVar4 = SmallArray<VmConstant_*,_8U>::operator[](this_00,0);
        if (((*ppVVar4)->super_VmValue).users.count == 1) {
          ppVVar4 = SmallArray<VmConstant_*,_8U>::operator[](this_00,0);
          ppVVar5 = SmallArray<VmValue_*,_8U>::operator[](&((*ppVVar4)->super_VmValue).users,0);
          if ((VmInstruction *)*ppVVar5 == pLVar3->storeInst) goto LAB_001a30cc;
        }
      }
LAB_001a30f9:
      index = index + 1;
    }
    if ((storeInst != (VmInstruction *)0x0) &&
       ((pLVar3->loadInst != (VmInstruction *)0x0 &&
        (bVar2 = IsLoadAliasedWithStore(pLVar3->loadInst,storeInst), !bVar2)))) goto LAB_001a30f9;
LAB_001a30cc:
    pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::back(this);
    pLVar6 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](this,index);
    for (lVar7 = 0x52; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined1 *)&pLVar6->loadInst = *(undefined1 *)&pLVar3->loadInst;
      pLVar3 = (LoadStoreInfo *)((long)pLVar3 + (ulong)bVar8 * -2 + 1);
      pLVar6 = (LoadStoreInfo *)((long)pLVar6 + (ulong)bVar8 * -2 + 1);
    }
    SmallArray<VmModule::LoadStoreInfo,_32U>::pop_back(this);
  } while( true );
}

Assistant:

void ClearLoadStoreInfoAliasing(VmModule *module, VmInstruction *storeInst)
	{
		for(unsigned i = 0; i < module->loadStoreInfo.size();)
		{
			VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

			if(el.noLoadOrNoContainerAlias && el.noStoreOrNoContainerAlias)
			{
				bool hasStore = el.storeAddress || el.storePointer;

				// Check if there is only a dead store user for this simple-use variable
				if(hasStore && el.storeAddress)
				{
					VariableData *container = el.storeAddress->container;

					if(container->users.count == 1 && container->users[0]->users.count == 1 && container->users[0]->users[0] == el.storeInst)
					{
						module->loadStoreInfo[i] = module->loadStoreInfo.back();
						module->loadStoreInfo.pop_back();
						continue;
					}
				}

				i++;
				continue;
			}

			// If a potentially aliasing store is made, check strict aliasing to the load instruction
			if(storeInst && el.loadInst && !IsLoadAliasedWithStore(el.loadInst, storeInst))
			{
				i++;
				continue;
			}

			module->loadStoreInfo[i] = module->loadStoreInfo.back();
			module->loadStoreInfo.pop_back();
		}
	}